

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

File * File::parse_file_text(File *__return_storage_ptr__,ifstream *in)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  istream *piVar5;
  long *plVar6;
  ulong uVar7;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  char cVar12;
  _Alloc_hider _Var13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  anon_class_8_1_02a47b0a errorInvalidFile;
  char ch_2;
  char ch;
  string temp;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  string type;
  anon_class_16_2_9d8d2ce4 ensureNoMoreInput;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  anon_class_16_2_51529e6d reuseLine;
  string str;
  anon_class_40_5_6335b36b parseInstructions;
  int line_count;
  string line;
  anon_class_32_4_7e715f1c readLine;
  anon_class_16_2_ad521349 errorLineInfo;
  stringstream ss;
  anon_class_8_1_02a47b0a local_978;
  char local_969;
  string local_968;
  Function local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  undefined1 *local_908;
  long local_900;
  undefined1 local_8f8;
  undefined7 uStack_8f7;
  stringstream *local_8e8;
  anon_class_8_1_02a47b0a *local_8e0;
  pointer local_8d8;
  pointer local_8d0;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_8c8;
  stringstream *local_8b0;
  string *local_8a8;
  long *local_8a0;
  ulong local_898;
  long local_890 [2];
  undefined1 local_880 [8];
  undefined1 local_878 [8];
  anon_class_32_4_7e715f1c local_870;
  int local_84c;
  File *local_848;
  ifstream *local_840;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  pointer local_758;
  string local_750;
  string local_730;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_710;
  string local_6f8;
  string local_6d8 [2];
  string local_698;
  string local_678;
  string local_658 [2];
  string local_618 [2];
  string local_5d8;
  string local_5b8;
  string local_598 [2];
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8 [2];
  string local_478 [2];
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  vector<vm::Function,_std::allocator<vm::Function>_> local_2b8;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_2a0;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  anon_class_32_4_7e715f1c local_1e8;
  anon_class_16_2_ad521349 local_1c8;
  long local_1b8 [3];
  string local_1a0 [104];
  ios_base local_138 [264];
  bool bVar17;
  
  local_84c = 0;
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  local_848 = __return_storage_ptr__;
  local_840 = in;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"");
  local_8a0 = local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"");
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_1e8.in = local_840;
  local_1e8.line_count = &local_84c;
  local_978.errorLineInfo = &local_1c8;
  local_8e8 = (stringstream *)local_1b8;
  local_8e0 = &local_978;
  local_8b0 = (stringstream *)local_1b8;
  local_8a8 = &local_838;
  local_1e8.line = &local_838;
  local_1e8.ss = (stringstream *)local_1b8;
  local_1c8.line_count = local_1e8.line_count;
  local_1c8.line = &local_838;
  parse_file_text::anon_class_32_4_7e715f1c::operator()(&local_1e8);
  local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>((istream *)local_1b8,(string *)&local_8a0);
  iVar2 = std::__cxx11::string::compare((char *)&local_8a0);
  if (iVar2 == 0) {
    *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) =
         *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) | 0x1000;
    piVar5 = std::operator>>((istream *)local_8e8,(char *)&local_968);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) goto LAB_001133ae;
    do {
      parse_file_text::anon_class_32_4_7e715f1c::operator()(&local_1e8);
      local_878 = (undefined1  [8])&local_870.line;
      local_870.in = (ifstream *)0x0;
      local_870.line = (string *)((ulong)local_870.line & 0xffffffffffffff00);
      local_870.ss._0_1_ = 0;
      local_948._0_8_ =
           &local_948.instructions.
            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_finish;
      local_948.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_948.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_948.instructions.
                            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_908 = &local_8f8;
      local_900 = 0;
      local_8f8 = 0;
      local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
      local_928._M_string_length = 0;
      local_928.field_2._M_allocated_capacity =
           local_928.field_2._M_allocated_capacity & 0xffffffffffffff00;
      piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_948);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_778,local_948._0_8_,
                   &(local_948.instructions.
                     super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                     super__Vector_impl_data._M_start)->op + local_948._0_8_);
        iVar3 = try_to_int(&local_778);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        if (((long)local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 - (long)iVar3 != 0)
        goto LAB_00112f8e;
        piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_908);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00112fc5;
        iVar2 = std::__cxx11::string::compare((char *)&local_908);
        if (iVar2 == 0) {
          local_880 = (undefined1  [8])((ulong)local_880 & 0xffffffffffffff00);
          *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
               *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
          piVar5 = std::operator>>((istream *)local_1b8,(char *)&local_968);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0011329b;
          if ((byte)local_968._M_dataplus._M_p != '\"') goto LAB_001132d2;
          while( true ) {
            while( true ) {
              plVar6 = (long *)std::istream::get((char *)local_1b8);
              uVar7 = *(ulong *)(*plVar6 + -0x18);
              if ((*(byte *)((long)plVar6 + uVar7 + 0x20) & 5) != 0) {
                local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_358,"no trailing quote for string constant","");
                parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_358);
                goto LAB_00112ddd;
              }
              cVar12 = (char)&local_928;
              if ((byte)local_968._M_dataplus._M_p != '\\') break;
              plVar6 = (long *)std::istream::get((char *)local_1b8);
              if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0)
              goto LAB_00112dee;
              if ((byte)local_968._M_dataplus._M_p < 0x6e) {
                uVar9 = (byte)local_968._M_dataplus._M_p - 0x22;
                if ((uVar9 < 0x3b) && ((0x400000000000021U >> ((ulong)uVar9 & 0x3f) & 1) != 0))
                goto LAB_00112169;
                goto LAB_00112f65;
              }
              if ((byte)local_968._M_dataplus._M_p < 0x74) {
                if (((byte)local_968._M_dataplus._M_p == 0x6e) ||
                   ((byte)local_968._M_dataplus._M_p == 0x72)) goto LAB_00112169;
                goto LAB_00112f65;
              }
              if ((byte)local_968._M_dataplus._M_p == 0x74) goto LAB_00112169;
              if ((byte)local_968._M_dataplus._M_p != 0x78) goto LAB_00112f65;
              plVar6 = (long *)std::istream::get((char *)local_1b8);
              if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0)
              goto LAB_00112ef7;
              if ((9 < (byte)((byte)local_968._M_dataplus._M_p - 0x30)) &&
                 ((0x25 < (byte)local_968._M_dataplus._M_p - 0x41 ||
                  ((0x3f0000003fU >> ((ulong)((byte)local_968._M_dataplus._M_p - 0x41) & 0x3f) & 1)
                   == 0)))) goto LAB_001135e6;
              if ((9 < (byte)((byte)local_968._M_dataplus._M_p - 0x30)) &&
                 ((5 < (byte)((byte)local_968._M_dataplus._M_p + 0x9f) &&
                  (5 < (byte)((byte)local_968._M_dataplus._M_p + 0xbf))))) goto LAB_001131bc;
              plVar6 = (long *)std::istream::get((char *)local_1b8);
              if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0)
              goto LAB_00112f2e;
              if ((9 < (byte)((byte)local_968._M_dataplus._M_p - 0x30)) &&
                 ((0x25 < (byte)local_968._M_dataplus._M_p - 0x41 ||
                  ((0x3f0000003fU >> ((ulong)((byte)local_968._M_dataplus._M_p - 0x41) & 0x3f) & 1)
                   == 0)))) goto LAB_001135af;
              if ((9 < (byte)((byte)local_968._M_dataplus._M_p - 0x30)) &&
                 ((5 < (byte)((byte)local_968._M_dataplus._M_p + 0x9f) &&
                  (5 < (byte)((byte)local_968._M_dataplus._M_p + 0xbf))))) goto LAB_001131bc;
              std::__cxx11::string::push_back(cVar12);
            }
            if ((byte)local_968._M_dataplus._M_p == '\"') break;
LAB_00112169:
            std::__cxx11::string::push_back(cVar12);
          }
          if ((pointer)0xffff < local_928._M_string_length) goto LAB_00113309;
          std::variant<std::__cxx11::string,int,double>::operator=
                    ((variant<std::__cxx11::string,int,double> *)local_878,&local_928);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_908);
          if (iVar2 == 0) {
            local_880[0] = 1;
            *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
                 *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
            piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_928);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0)
            goto LAB_00113340;
            local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_730,local_928._M_dataplus._M_p,
                       local_928._M_dataplus._M_p + (long)(u2 *)local_928._M_string_length);
            iVar3 = try_to_int(&local_730);
            local_968._M_dataplus._M_p._0_4_ = iVar3;
            std::variant<std::__cxx11::string,int,double>::operator=
                      ((variant<std::__cxx11::string,int,double> *)local_878,(int *)&local_968);
            uVar11 = local_730.field_2._M_allocated_capacity;
            _Var13._M_p = local_730._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_730._M_dataplus._M_p != &local_730.field_2) {
LAB_00112237:
              operator_delete(_Var13._M_p,uVar11 + 1);
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_908);
            if (iVar2 != 0) goto LAB_0011322d;
            local_880[0] = 2;
            *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
                 *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
            piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_928);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0)
            goto LAB_00113264;
            local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_750,local_928._M_dataplus._M_p,
                       local_928._M_dataplus._M_p + (long)(u2 *)local_928._M_string_length);
            local_968._M_dataplus._M_p = (pointer)try_to_double(&local_750);
            std::variant<std::__cxx11::string,int,double>::operator=
                      ((variant<std::__cxx11::string,int,double> *)local_878,(double *)&local_968);
            uVar11 = local_750.field_2._M_allocated_capacity;
            _Var13._M_p = local_750._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_750._M_dataplus._M_p != &local_750.field_2) goto LAB_00112237;
          }
        }
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::emplace_back<vm::Constant>
                  (&local_8c8,(Constant *)local_880);
        *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) =
             *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) | 0x1000;
        piVar5 = std::operator>>((istream *)local_8e8,&local_969);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) goto LAB_00112ffc;
        bVar16 = true;
      }
      else {
        std::__cxx11::stringbuf::str((string *)(local_8b0 + 0x18));
        bVar16 = false;
        std::ios::clear((int)local_8b0 + (int)*(undefined8 *)(*(long *)local_8b0 + -0x18));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p != &local_928.field_2) {
        operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
      }
      if (local_908 != &local_8f8) {
        operator_delete(local_908,CONCAT71(uStack_8f7,local_8f8) + 1);
      }
      if ((pointer *)local_948._0_8_ !=
          &local_948.instructions.
           super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)local_948._0_8_,
                        (ulong)&(local_948.instructions.
                                 super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>_&>
        ::_S_vtable._M_arr[(byte)local_870.ss]._M_data)
                ((anon_class_1_0_00000001 *)&local_968,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                  *)local_878);
    } while (bVar16);
    if (0xffff < (ulong)(((long)local_8c8.
                                super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_8c8.
                                super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                        )) goto LAB_001133ef;
    local_880 = (undefined1  [8])&local_1e8;
    local_870.in = (ifstream *)&local_8b0;
    local_870.line_count = (int *)&local_8e8;
    local_878 = (undefined1  [8])local_1b8;
    local_870.line = (string *)&local_978;
    std::operator>>((istream *)local_1b8,(string *)&local_8a0);
    iVar2 = std::__cxx11::string::compare((char *)&local_8a0);
    if (iVar2 != 0) goto LAB_00113426;
    *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) =
         *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) | 0x1000;
    piVar5 = std::operator>>((istream *)local_8e8,(char *)&local_948);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) goto LAB_0011345d;
    parse_file_text::anon_class_40_5_6335b36b::operator()
              ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&local_968,
               (anon_class_40_5_6335b36b *)local_880);
    local_8d0 = (pointer)local_968._M_dataplus._M_p;
    local_758 = (pointer)local_968._M_string_length;
    local_8d8 = (pointer)local_968.field_2._M_allocated_capacity;
    local_928._M_dataplus._M_p = (pointer)0x0;
    local_928._M_string_length = 0;
    local_928.field_2._M_allocated_capacity = 0;
    std::operator>>((istream *)local_1b8,(string *)&local_8a0);
    iVar2 = std::__cxx11::string::compare((char *)&local_8a0);
    if (iVar2 != 0) goto LAB_00113498;
    *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) =
         *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) | 0x1000;
    piVar5 = std::operator>>((istream *)local_8e8,(char *)&local_948);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) goto LAB_001134cf;
    bVar17 = false;
    bVar16 = false;
    do {
      parse_file_text::anon_class_32_4_7e715f1c::operator()(&local_1e8);
      local_948.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_948.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_948.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_908 = &local_8f8;
      local_900 = 0;
      local_8f8 = 0;
      piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_908);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_798,local_908,local_908 + local_900);
        iVar3 = try_to_int(&local_798);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
        }
        if ((long)(local_928._M_string_length - (long)local_928._M_dataplus._M_p) >> 5 !=
            (long)iVar3) goto LAB_00113117;
        piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_908);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00113185;
        local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7b8,local_908,local_908 + local_900);
        iVar3 = try_to_int(&local_7b8);
        local_948.nameIndex = (short)iVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
          operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
        }
        uVar7 = ((long)local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        if (uVar7 < (local_948._0_8_ & 0xffff) || uVar7 - (local_948._0_8_ & 0xffff) == 0)
        goto LAB_0011314e;
        if ((&(local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
               super__Vector_impl_data._M_start)->type)[(uint)local_948.nameIndex * 0x30] != STRING)
        goto LAB_00113037;
        pvVar8 = std::get<0ul,std::__cxx11::string,int,double>
                           ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                             *)((long)&((local_8c8.
                                         super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->value).
                                       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                       .
                                       super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                               + (ulong)((uint)local_948.nameIndex * 0x30)));
        iVar2 = std::__cxx11::string::compare((char *)pvVar8);
        bVar16 = bVar17;
        if (iVar2 == 0) {
          bVar16 = true;
        }
        piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_908);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_001130a5;
        local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d8,local_908,local_908 + local_900);
        iVar3 = try_to_int(&local_7d8);
        local_948.paramSize = (u2)iVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_908);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0011306e;
        local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7f8,local_908,local_908 + local_900);
        iVar3 = try_to_int(&local_7f8);
        local_948.level = (u2)iVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
          operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
        }
        std::vector<vm::Function,_std::allocator<vm::Function>_>::emplace_back<vm::Function>
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)&local_928,&local_948);
        *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) =
             *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) | 0x1000;
        piVar5 = std::operator>>((istream *)local_8e8,&local_969);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) goto LAB_001130dc;
        bVar1 = true;
        bVar17 = bVar16;
      }
      else {
        std::__cxx11::stringbuf::str((string *)(local_8b0 + 0x18));
        bVar1 = false;
        std::ios::clear((int)local_8b0 + (int)*(undefined8 *)(*(long *)local_8b0 + -0x18));
      }
      if (local_908 != &local_8f8) {
        operator_delete(local_908,CONCAT71(uStack_8f7,local_8f8) + 1);
      }
      if (local_948.instructions.
          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_948.instructions.
                        super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_948.instructions.
                              super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_948.instructions.
                              super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (bVar1);
    if (!bVar16) goto LAB_0011350a;
    uVar9 = (uint)(local_928._M_string_length - (long)local_928._M_dataplus._M_p >> 5);
    if ((int)uVar9 < 0x10000) {
      local_948._0_8_ = local_948._0_8_ & 0xffffffff00000000;
      if (0 < (int)uVar9) {
        do {
          piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_8a0);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00112e4e;
          if ((local_898 < 2) || (*(char *)((long)local_8a0 + (local_898 - 1)) != ':'))
          goto LAB_00112e25;
          std::__cxx11::string::pop_back();
          if ((char)*local_8a0 == '.') {
            std::__cxx11::string::_M_erase((ulong)&local_8a0,0);
            std::__cxx11::stringbuf::str(local_1a0);
            std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + (int)(istream *)local_1b8);
            *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
                 *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
            std::operator>>((istream *)local_1b8,(char *)&local_908);
            uVar15 = 0xffffffff;
            if (((byte)local_908._0_1_ & 0xdf) != 0x46) goto LAB_00112b6b;
            local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
            local_968._M_string_length = 0;
            local_968.field_2._M_allocated_capacity =
                 local_968.field_2._M_allocated_capacity & 0xffffffffffffff00;
            piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_968);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
              local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_818,local_968._M_dataplus._M_p,
                         local_968._M_dataplus._M_p + (long)(OpCode *)local_968._M_string_length);
              uVar4 = try_to_int(&local_818);
              uVar15 = (ulong)uVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_818._M_dataplus._M_p != &local_818.field_2) {
                operator_delete(local_818._M_dataplus._M_p,
                                local_818.field_2._M_allocated_capacity + 1);
              }
              if (uVar4 == local_948._0_4_) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_968._M_dataplus._M_p != &local_968.field_2) {
                  operator_delete(local_968._M_dataplus._M_p,
                                  local_968.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00112b6b;
              }
            }
            else {
              strfmt<int>(&local_268,"\".F{}:\" expected",(int *)&local_948);
              parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_268);
            }
            strfmt<int>(&local_288,"\".F{}:\" expected",(int *)&local_948);
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_288);
LAB_0011322d:
            local_4b8[0]._M_dataplus._M_p = (pointer)&local_4b8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4b8,"invalid constant type","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,local_4b8);
LAB_00113264:
            local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"invalid format","")
            ;
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,local_478);
LAB_0011329b:
            local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_318,"string constant expected","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_318);
LAB_001132d2:
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_338,"no leading qoute for string constant","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_338);
LAB_00113309:
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_418,"too long the string constant","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_418);
LAB_00113340:
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_438,"invalid format","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_438);
            goto LAB_00113377;
          }
          lVar14 = 0;
          uVar15 = 0;
          do {
            uVar7 = uVar15;
            if ((ulong)((long)(local_928._M_string_length - (long)local_928._M_dataplus._M_p) >> 5)
                <= uVar15) goto LAB_00112ddd;
            uVar7 = (ulong)*(ushort *)(local_928._M_dataplus._M_p + lVar14);
            uVar10 = ((long)local_8c8.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_8c8.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
            if (uVar10 < uVar7 || uVar10 - uVar7 == 0) goto LAB_00112ddd;
            pvVar8 = std::get<0ul,std::__cxx11::string,int,double>
                               ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                 *)((long)&((local_8c8.
                                             super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->value).
                                           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                           .
                                           super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   + (ulong)((uint)*(ushort *)(local_928._M_dataplus._M_p + lVar14)
                                            * 0x30)));
            __n = pvVar8->_M_string_length;
            if ((__n == local_898) &&
               ((__n == 0 || (iVar2 = bcmp((pvVar8->_M_dataplus)._M_p,local_8a0,__n), iVar2 == 0))))
            goto LAB_00112b6b;
            uVar15 = uVar15 + 1;
            lVar14 = lVar14 + 0x20;
          } while ((uVar9 & 0x7fffffff) != uVar15);
          uVar15 = 0xffffffff;
LAB_00112b6b:
          *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) =
               *(uint *)(local_8e8 + *(long *)(*(long *)local_8e8 + -0x18) + 0x18) | 0x1000;
          piVar5 = std::operator>>((istream *)local_8e8,(char *)&local_908);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) goto LAB_00112e77;
          if ((int)uVar15 < 0) goto LAB_00112eb2;
          parse_file_text::anon_class_40_5_6335b36b::operator()
                    ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&local_968,
                     (anon_class_40_5_6335b36b *)local_880);
          if ((ulong)((long)(local_928._M_string_length - (long)local_928._M_dataplus._M_p) >> 5) <=
              (uVar15 & 0xffffffff)) goto LAB_00112ee9;
          std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::_M_move_assign
                    ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)
                     (local_928._M_dataplus._M_p + (uVar15 & 0xffffffff) * 0x20 + 8),&local_968);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_968._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_968._M_dataplus._M_p,
                            local_968.field_2._M_allocated_capacity -
                            (long)local_968._M_dataplus._M_p);
          }
          iVar2 = local_948._0_4_ + 1;
          local_948._0_4_ = iVar2;
        } while (iVar2 < (int)uVar9);
      }
      piVar5 = std::operator>>((istream *)local_840,(string *)&local_8a0);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        local_2a0.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_2a0.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2a0.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8c8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_710.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_start = local_8d0;
        local_710.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_finish = local_758;
        local_710.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_8d8;
        local_2b8.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_928._M_dataplus._M_p;
        local_2b8.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_928._M_string_length;
        local_2b8.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_928.field_2._M_allocated_capacity
        ;
        local_928._M_dataplus._M_p = (pointer)0x0;
        local_928._M_string_length = 0;
        local_928.field_2._M_allocated_capacity = 0;
        File(local_848,1,&local_2a0,&local_710,&local_2b8);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_2b8);
        if (local_710.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_710.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_710.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_710.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_2a0);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)&local_928);
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_8c8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_8a0 != local_890) {
          operator_delete(local_8a0,local_890[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_838._M_dataplus._M_p != &local_838.field_2) {
          operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
        }
        return local_848;
      }
      goto LAB_00113578;
    }
  }
  else {
LAB_00113377:
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,".constants expected","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_4d8);
LAB_001133ae:
    local_880 = (undefined1  [8])(local_878 + 8);
    local_870.in = (ifstream *)0x2064696c61766e69;
    local_878 = (undefined1  [8])0xc;
    local_870.line = (string *)CONCAT35(local_870.line._5_3_,0x656e696c);
    parse_file_text::anon_class_8_1_02a47b0a::operator()(local_8e0,(string *)local_880);
LAB_001133ef:
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"too many constants","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_4f8);
LAB_00113426:
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,".start expected","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_518);
LAB_0011345d:
    local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
    local_968.field_2._M_allocated_capacity = 0x2064696c61766e69;
    local_968.field_2._8_4_ = 0x656e696c;
    local_968._M_string_length = 0xc;
    local_968.field_2._M_local_buf[0xc] = '\0';
    parse_file_text::anon_class_8_1_02a47b0a::operator()(local_8e0,&local_968);
LAB_00113498:
    local_658[0]._M_dataplus._M_p = (pointer)&local_658[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,".functions expected","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,local_658);
LAB_001134cf:
    local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
    local_968.field_2._M_allocated_capacity = 0x2064696c61766e69;
    local_968.field_2._8_4_ = 0x656e696c;
    local_968._M_string_length = 0xc;
    local_968.field_2._M_local_buf[0xc] = '\0';
    parse_file_text::anon_class_8_1_02a47b0a::operator()(local_8e0,&local_968);
LAB_0011350a:
    local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"main() not found","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_678);
  }
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"too many functions","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_698);
LAB_00113578:
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"unused content","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_6f8);
LAB_001135af:
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"invalid hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_3f8);
LAB_001135e6:
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"invalid hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_3b8);
  if (local_908 != &local_8f8) {
    operator_delete(local_908,CONCAT71(uStack_8f7,local_8f8) + 1);
  }
  if (local_948.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_948.instructions.
                    super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_948.instructions.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_948.instructions.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
            ((vector<vm::Function,_std::allocator<vm::Function>_> *)&local_928);
  if (local_8d0 != (pointer)0x0) {
    operator_delete(local_8d0,(long)local_8d8 - (long)local_8d0);
  }
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_8c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_8a0 != local_890) {
    operator_delete(local_8a0,local_890[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(&local_3b8.field_2);
LAB_00112ddd:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
LAB_00112dee:
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"incomplete escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_378);
LAB_00112e25:
  strfmt<int>(&local_248,"\".F{}:\" expected",(int *)&local_948);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_248);
LAB_00112e4e:
  strfmt<int>(&local_228,"\".F{}:\" expected",(int *)&local_948);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_228);
LAB_00112e77:
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  local_968.field_2._M_allocated_capacity = 0x2064696c61766e69;
  local_968.field_2._8_4_ = 0x656e696c;
  local_968._M_string_length = 0xc;
  local_968.field_2._M_local_buf[0xc] = '\0';
  parse_file_text::anon_class_8_1_02a47b0a::operator()(local_8e0,&local_968);
LAB_00112eb2:
  local_6d8[0]._M_dataplus._M_p = (pointer)&local_6d8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"no such function","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,local_6d8);
LAB_00112ee9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00112ef7:
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_398,"incomplete hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_398);
LAB_00112f2e:
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"incomplete hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_3d8);
LAB_00112f65:
  strfmt<char>(&local_208,"unknown escape seq \"\\{}\"",(char *)&local_968);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_208);
LAB_00112f8e:
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"unordered index","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_2d8);
LAB_00112fc5:
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"constant type expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_2f8);
LAB_00112ffc:
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  local_968.field_2._M_allocated_capacity = 0x2064696c61766e69;
  local_968.field_2._8_4_ = 0x656e696c;
  local_968._M_string_length = 0xc;
  local_968.field_2._M_local_buf[0xc] = '\0';
  parse_file_text::anon_class_8_1_02a47b0a::operator()(local_8e0,&local_968);
LAB_00113037:
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"name not found","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_5b8);
LAB_0011306e:
  local_618[0]._M_dataplus._M_p = (pointer)&local_618[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"level expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,local_618);
LAB_001130a5:
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"param_size expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_5d8);
LAB_001130dc:
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  local_968.field_2._M_allocated_capacity = 0x2064696c61766e69;
  local_968.field_2._8_4_ = 0x656e696c;
  local_968._M_string_length = 0xc;
  local_968.field_2._M_local_buf[0xc] = '\0';
  parse_file_text::anon_class_8_1_02a47b0a::operator()(local_8e0,&local_968);
LAB_00113117:
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"unordered index","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_538);
LAB_0011314e:
  local_598[0]._M_dataplus._M_p = (pointer)&local_598[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"name not found","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,local_598);
LAB_00113185:
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"name_index expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&local_978,&local_558);
LAB_001131bc:
  __assert_fail("(\"unknown error\", false)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/./././util/util.hpp"
                ,0x1c,"int hex_digit_to_int(unsigned char)");
}

Assistant:

File File::parse_file_text(std::ifstream& in) {
    int line_count = 0;
    std::string line = "";
    std::string str = "";
    std::stringstream ss;
    const auto readLine = [&]() {
        while(std::getline(in, line)) {
            ++line_count;
            // remove comment
            if (auto ed = line.find_first_of('#'); ed != std::string::npos) {
                line.resize(ed); 
                // line.erase(line.begin()+ed, line.end());
            }
            // remove leading and trailing whitespaces
            line = trim(std::move(line));
            // not a blank line     
            if (!line.empty()) {
                ss.str(line);
                ss.clear();
                return;
            }
        }
        // eof
        line = "";
        ss.str("");
        ss.clear();
    };
    const auto reuseLine = [&]() {
        ss.str(line);
        ss.clear();
    };
    const auto errorLineInfo = [&]() {
        println(std::cerr, "line", line_count, ":\n   ", line);
    };
    const auto errorInvalidFile = [&](std::string msg) {
        errorLineInfo();
        throw InvalidFile(msg);
    };
    #define errorIf(cond, msg)    do { if ((cond)) { errorInvalidFile((msg)); } } while(false)
    #define errorIfNot(cond, msg) errorIf(!(cond), (msg))
    #define errorIfAssignFailed(lhs, rhs, msg) do { try { lhs = (rhs); } catch (const std::exception&) { errorIf(true, (msg)); } } while(false)
    auto ensureNoMoreInput = [&]() {
        if (char ch; ss >> std::skipws >> ch) {
            errorIf(true, "invalid line");
        }
    };

    readLine();

    // parse constants
    std::vector<vm::Constant> constants;
    ss >> str;
    if (str == ".constants:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {type} {value}
            readLine();
            vm::Constant constant;
            std::string temp;
            int index;
            std::string type;
            std::string value;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != constants.size(), "unordered index");
            errorIfNot(ss >> type, "constant type expected");
            if (type == "S") {
                constant.type = vm::Constant::Type::STRING;
                char ch;
                errorIfNot(ss >> std::skipws >> ch, "string constant expected");
                errorIf(ch != '\"', "no leading qoute for string constant");
                // parse the content of string
                while (true) {
                    errorIfNot(ss.get(ch), "no trailing quote for string constant");
                    if (ch == '\"') { 
                        break; 
                    }
                    if (ch == '\\') {
                        errorIfNot(ss.get(ch), "incomplete escape seq");
                        switch (ch) {
                        case '\\': value += '\\'; break;
                        case '\'': value += '\''; break;
                        case '\"': value += '\"'; break;
                        case 'n':  value += '\n'; break;
                        case 'r':  value += '\r'; break;
                        case 't':  value += '\t'; break;
                        case 'x': {
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            char v = (0xff & hex_digit_to_int(ch)) << 4;
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            v |= (0xff & hex_digit_to_int(ch));
                            value += v;
                        }; break;
                        default: errorIf(true, strfmt("unknown escape seq \"\\{}\"", ch));
                        }
                    }
                    else {
                        value += ch;
                    }
                }
                errorIf(value.length() > UINT16_MAX, "too long the string constant");
                constant.value = std::move(value);
            }
            else if (type == "I") {
                constant.type = vm::Constant::Type::INT;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_int(value), "out of range or invalid format");
            }
            else if (type == "D") {
                constant.type = vm::Constant::Type::DOUBLE;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_double(value), "out of range or invalid format");
            }
            else {
                errorIf(true, "invalid constant type");
            }
            constants.push_back(std::move(constant));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".constants expected");
    }
    errorIf(constants.size() > U2_MAX, "too many constants");

    // parse instructions
    auto parseInstructions = [&]() {
        std::vector<vm::Instruction> rtv;
        while(true) {
            // {index} {opcode} {param1} {param2}
            readLine();
            std::string temp;
            int index;
            std::string opName;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != rtv.size(), "unordered index");
            errorIfNot(ss >> opName, "opcode expected");
            opName = to_lower(opName);
            vm::Instruction ins;
            if (auto it = vm::opCodeOfName.find(opName); true) {
                errorIf(it == vm::opCodeOfName.end(), "no such opcode");
                ins.op = it->second;
            }
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                int paramCount = it->second.size();
                std::string restLine;
                errorIfNot(std::getline(ss, restLine), "parameters expected");
                auto params = split(restLine, ',');
                errorIf(params.size() != paramCount, 
                    strfmt("{} parameters expected, {} got", paramCount, params.size())
                );
                errorIfAssignFailed(ins.x, try_to_int(params[0]), 
                    strfmt("invalid first parameter: {}", params[0])
                );
                if (paramCount == 2) {
                    errorIfAssignFailed(ins.y, try_to_int(params[1]), 
                        strfmt("invalid second parameter: {}", params[1])
                    );
                }
            }
            ensureNoMoreInput();
            rtv.push_back(ins);
        }
        errorIf(rtv.size() > U2_MAX, "too many instructions");
        return rtv;
    };

    // parse start
    std::vector<vm::Instruction> start;
    ss >> str;
    if (str == ".start:") {
        ensureNoMoreInput();
        start = std::move(parseInstructions());
    }
    else {
        errorIf(true, ".start expected");
    }

    // parse functions
    std::vector<vm::Function> functions;
    bool mainFound = false;
    ss >> str;
    if (str == ".functions:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {nameIndex} {paramSize} {level}
            readLine();
            vm::Function function;
            std::string temp;
            int index;
            // no more function
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != functions.size(), "unordered index");
            errorIfNot(ss >> temp, "name_index expected");
            errorIfAssignFailed(function.nameIndex, try_to_int(temp), "invalid name_index");
            errorIf(function.nameIndex >= constants.size(), "name not found");
            errorIf(constants[function.nameIndex].type != vm::Constant::Type::STRING, "name not found");
            if (std::get<vm::str_t>(constants[function.nameIndex].value) == "main") {
                mainFound = true;
            }
            errorIfNot(ss >> temp, "param_size expected");
            errorIfAssignFailed(function.paramSize, try_to_int(temp), "invalid param_size");
            errorIf(function.paramSize > U2_MAX, "too many parameters");
            errorIfNot(ss >> temp, "level expected");
            errorIfAssignFailed(function.level, try_to_int(temp), "invalid level");
            errorIf(function.level > U2_MAX, "too high the level");
            functions.push_back(std::move(function));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".functions expected");
    }
    errorIfNot(mainFound, "main() not found");

    int functions_count = functions.size();
    errorIf(functions_count > U2_MAX, "too many functions");
    for (int i = 0; i < functions_count; ++i) {
        errorIfNot(ss >> str, strfmt("\".F{}:\" expected", i));
        errorIf((str.length() < 2 || str.back() != ':'), strfmt("\".F{}:\" expected", i));
        str.pop_back();

        int index = -1;
        if (str.front() == '.') {
            str.erase(str.begin());
            ss.str(str);
            ss.clear();
            char ch;
            ss >> std::skipws >> ch;
            if ((ch == 'F' || ch == 'f')) {
                // .Fx
                std::string temp;
                errorIfNot(ss >> temp, strfmt("\".F{}:\" expected", i));
                errorIfAssignFailed(index, try_to_int(temp), "invalid function index");
                errorIf(index != i, strfmt("\".F{}:\" expected", i));
            }
        }
        else {
            // str is name
            index = -1;
            for (auto j = 0; j < functions_count; ++j) {
                if (std::get<std::string>(constants.at(functions.at(j).nameIndex).value) == str) {
                    index = j;
                    break;
                }
            } 
        }
        ensureNoMoreInput();
        errorIf(index < 0, "no such function");
        functions.at(index).instructions = std::move(parseInstructions());
    }

    errorIf(in >> str, "unused content");

    return File{0x00000001, std::move(constants), std::move(start), std::move(functions)};
}